

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
pstore::small_vector<unsigned_char,_128UL>::switch_to_big
          (small_vector<unsigned_char,_128UL> *this,size_t new_elements)

{
  uchar *__first;
  uchar *puVar1;
  size_t sVar2;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __result;
  size_t new_elements_local;
  small_vector<unsigned_char,_128UL> *this_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->big_buffer_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (&this->big_buffer_,new_elements);
  __first = this->buffer_;
  puVar1 = this->buffer_;
  sVar2 = this->elements_;
  __result = std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       (&this->big_buffer_);
  std::
  copy<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (__first,puVar1 + sVar2,__result);
  set_buffer_ptr(this,new_elements);
  return;
}

Assistant:

void small_vector<ElementType, BodyElements>::switch_to_big (std::size_t new_elements) {
        big_buffer_.clear ();
        big_buffer_.reserve (new_elements);
        std::copy (buffer_, buffer_ + elements_, std::back_inserter (big_buffer_));
        this->set_buffer_ptr (new_elements);
    }